

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcombobox_p.h
# Opt level: O2

void __thiscall
QComboBoxPrivateScroller::paintEvent(QComboBoxPrivateScroller *this,QPaintEvent *param_1)

{
  QStyle *pQVar1;
  long in_FS_OFFSET;
  QRect local_c8;
  QPainter p;
  QStyleOptionMenuItem local_b0;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  _p = &DAT_aaaaaaaaaaaaaaaa;
  QPainter::QPainter(&p,&(this->super_QWidget).super_QPaintDevice);
  memset(&local_b0,0xaa,0x98);
  QStyleOptionMenuItem::QStyleOptionMenuItem(&local_b0);
  QStyleOption::initFrom(&local_b0.super_QStyleOption,&this->super_QWidget);
  local_b0.checkType = NotCheckable;
  local_b0.menuRect = QWidget::rect(&this->super_QWidget);
  local_b0.maxIconWidth = 0;
  local_b0.reservedShortcutWidth = 0;
  local_b0.menuItemType = Scroller;
  if (this->sliderAction == SliderSingleStepAdd) {
    local_b0.super_QStyleOption.state.super_QFlagsStorageHelper<QStyle::StateFlag,_4>.
    super_QFlagsStorage<QStyle::StateFlag>.i._0_1_ =
         (byte)local_b0.super_QStyleOption.state.super_QFlagsStorageHelper<QStyle::StateFlag,_4>.
               super_QFlagsStorage<QStyle::StateFlag>.i | 0x40;
  }
  local_c8 = QWidget::rect(&this->super_QWidget);
  QPainter::eraseRect(&p,&local_c8);
  pQVar1 = QWidget::style(&this->super_QWidget);
  (**(code **)(*(long *)pQVar1 + 0xb8))(pQVar1,0xf,&local_b0,&p,0);
  QStyleOptionMenuItem::~QStyleOptionMenuItem(&local_b0);
  QPainter::~QPainter(&p);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void paintEvent(QPaintEvent *) override {
        QPainter p(this);
        QStyleOptionMenuItem menuOpt;
        menuOpt.initFrom(this);
        menuOpt.checkType = QStyleOptionMenuItem::NotCheckable;
        menuOpt.menuRect = rect();
        menuOpt.maxIconWidth = 0;
        menuOpt.reservedShortcutWidth = 0;
        menuOpt.menuItemType = QStyleOptionMenuItem::Scroller;
        if (sliderAction == QAbstractSlider::SliderSingleStepAdd)
            menuOpt.state |= QStyle::State_DownArrow;
        p.eraseRect(rect());
        style()->drawControl(QStyle::CE_MenuScroller, &menuOpt, &p);
    }